

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_parser.h
# Opt level: O0

void __thiscall CMakeParser::SetDebugMode(CMakeParser *this,DebugMode mode)

{
  DebugMode mode_local;
  CMakeParser *this_local;
  
  switch(mode) {
  case Disabled:
    yy::parser::set_debug_level(&this->parser,0);
    CMakeScanner::SetDebug(&this->scanner,false);
    break;
  case Parser:
    yy::parser::set_debug_level(&this->parser,1);
    break;
  case Scanner:
    CMakeScanner::SetDebug(&this->scanner,true);
    break;
  case Full:
    yy::parser::set_debug_level(&this->parser,1);
    CMakeScanner::SetDebug(&this->scanner,true);
  }
  return;
}

Assistant:

void SetDebugMode(const DebugMode mode)
    {
        switch(mode)
        {
        case DebugMode::Disabled:
            parser.set_debug_level(0);
            scanner.SetDebug(false);
            break;
        case DebugMode::Parser:
            parser.set_debug_level(1);
            break;
        case DebugMode::Scanner:
            scanner.SetDebug(true);
            break;
        case DebugMode::Full:
            parser.set_debug_level(1);
            scanner.SetDebug(true);
            break;
        default:
            break;
        }
    }